

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_ns_t>
               (timestamp_t input,timestamp_ns_t *result,bool strict)

{
  ConversionException *this;
  bool bVar1;
  string local_40;
  
  bVar1 = TryMultiplyOperator::Operation<long,long,long>(input.value,1000000,(int64_t *)result);
  if (bVar1) {
    return true;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Could not convert TIMESTAMP to TIMESTAMP_NS","");
  ConversionException::ConversionException(this,&local_40);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool TryCast::Operation(timestamp_t input, timestamp_ns_t &result, bool strict) {
	D_ASSERT(Timestamp::IsFinite(input));
	if (!TryMultiplyOperator::Operation(input.value, Interval::NANOS_PER_MSEC, result.value)) {
		throw ConversionException("Could not convert TIMESTAMP to TIMESTAMP_NS");
	}
	return true;
}